

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O0

void I_FreezeTimePolled(bool frozen)

{
  int iVar1;
  int iVar2;
  int now;
  int froze;
  bool frozen_local;
  
  iVar1 = TicFrozen;
  if (frozen) {
    if (TicFrozen != 0) {
      __assert_fail("TicFrozen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/posix/sdl/i_timer.cpp"
                    ,0x6c,"void I_FreezeTimePolled(bool)");
    }
    TicFrozen = I_GetTimePolled(false);
  }
  else {
    if (TicFrozen == 0) {
      __assert_fail("TicFrozen != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/posix/sdl/i_timer.cpp"
                    ,0x71,"void I_FreezeTimePolled(bool)");
    }
    TicFrozen = 0;
    iVar2 = I_GetTimePolled(false);
    BaseTime = ((iVar2 - iVar1) * 1000) / 0x23 + BaseTime;
  }
  return;
}

Assistant:

void I_FreezeTimePolled (bool frozen)
{
	if (frozen)
	{
		assert(TicFrozen == 0);
		TicFrozen = I_GetTimePolled(false);
	}
	else
	{
		assert(TicFrozen != 0);
		int froze = TicFrozen;
		TicFrozen = 0;
		int now = I_GetTimePolled(false);
		BaseTime += (now - froze) * 1000 / TICRATE;
	}
}